

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtStrategy.cpp
# Opt level: O0

optional<Vault::AuthenticationResponse> * __thiscall
Vault::JwtStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,JwtStrategy *this,
          Client *client)

{
  anon_class_8_1_8991fb9c local_c0;
  NoArgJsonProducer local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  Client *local_20;
  Client *client_local;
  JwtStrategy *this_local;
  
  local_20 = client;
  client_local = (Client *)this;
  this_local = (JwtStrategy *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/login",&local_81);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&local_80);
  getUrl(&local_40,this,client,&local_60);
  local_c0.this = this;
  std::function<std::__cxx11::string()>::
  function<Vault::JwtStrategy::authenticate(Vault::Client_const&)::__0,void>
            ((function<std::__cxx11::string()> *)&local_b8,&local_c0);
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_40,&local_b8);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function(&local_b8);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::JwtStrategy::authenticate(const Vault::Client &client) {
  return HttpConsumer::authenticate(client, getUrl(client, Vault::Path{"/login"}), [this]() {
    nlohmann::json j;
    j = nlohmann::json::object();
    j["role"] = role_.value();
    j["jwt"] = jwt_.value();
    return j.dump();
  });
}